

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

Value * apply_check_bigger_equal_operation(Value *left_value,Value *right_value)

{
  ValueType VVar1;
  long lVar2;
  longlong lVar3;
  longlong lVar4;
  Value *pVVar5;
  bool bVar6;
  longdouble lVar7;
  longdouble lVar8;
  
  VVar1 = left_value->value_type;
  if ((VVar1 == ValueTypeIntegerValue) && (right_value->value_type == ValueTypeIntegerValue)) {
    bVar6 = SBORROW8(*(long *)(left_value + 1),*(long *)(right_value + 1));
    lVar2 = *(long *)(left_value + 1) - *(long *)(right_value + 1);
  }
  else {
    if (((VVar1 & ~ValueTypeBoolValue) == ValueTypeIntegerValue) &&
       ((right_value->value_type & ~ValueTypeBoolValue) == ValueTypeIntegerValue)) {
      if (VVar1 == ValueTypeFloatValue) {
        lVar7 = *(longdouble *)&left_value[1].linked_variable_count;
      }
      else {
        lVar7 = (longdouble)*(long *)(left_value + 1);
      }
      if (right_value->value_type == ValueTypeFloatValue) {
        lVar8 = *(longdouble *)&right_value[1].linked_variable_count;
      }
      else {
        lVar8 = (longdouble)*(long *)(right_value + 1);
      }
      bVar6 = lVar8 <= lVar7;
      goto LAB_00108173;
    }
    lVar3 = convert_to_integer(left_value);
    lVar4 = convert_to_integer(right_value);
    bVar6 = SBORROW8(lVar3,lVar4);
    lVar2 = lVar3 - lVar4;
  }
  bVar6 = bVar6 == lVar2 < 0;
LAB_00108173:
  pVVar5 = new_bool_value(bVar6);
  return pVVar5;
}

Assistant:

Value *apply_check_bigger_equal_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
    return new_bool_value(((IntegerValue *) left_value)->integer_value >= ((IntegerValue *) right_value)->integer_value);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    return new_bool_value(left_float >= right_float);
  }

  return new_bool_value(convert_to_integer(left_value) >= convert_to_integer(right_value));
}